

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

char * Fmt_abi_cxx11_(char *fmt,...)

{
  char in_AL;
  char *__p;
  pointer pcVar1;
  ulong uVar2;
  runtime_error *this;
  undefined8 in_RCX;
  undefined8 in_RDX;
  char *in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  bool bVar3;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_118 [16];
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  uint local_60;
  allocator local_49;
  unique_ptr<char[],_std::default_delete<char[]>_> local_48;
  unique_ptr<char[],_std::default_delete<char[]>_> buffer;
  undefined4 local_38;
  int size;
  va_list vl;
  char *fmt_local;
  
  if (in_AL != '\0') {
    local_e8 = in_XMM0_Qa;
    local_d8 = in_XMM1_Qa;
    local_c8 = in_XMM2_Qa;
    local_b8 = in_XMM3_Qa;
    local_a8 = in_XMM4_Qa;
    local_98 = in_XMM5_Qa;
    local_88 = in_XMM6_Qa;
    local_78 = in_XMM7_Qa;
  }
  vl[0].overflow_arg_area = local_118;
  vl[0]._0_8_ = &stack0x00000008;
  size = 0x30;
  local_38 = 0x10;
  local_108 = in_RDX;
  local_100 = in_RCX;
  local_f8 = in_R8;
  local_f0 = in_R9;
  buffer._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl._4_4_ = vsnprintf((char *)0x0,0,in_RSI,&local_38);
  if (buffer._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
      super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
      super__Head_base<0UL,_char_*,_false>._M_head_impl._4_4_ != -1) {
    __p = (char *)operator_new__((long)(buffer._M_t.
                                        super___uniq_ptr_impl<char,_std::default_delete<char[]>_>.
                                        _M_t.
                                        super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>
                                        .super__Head_base<0UL,_char_*,_false>._M_head_impl._4_4_ + 1
                                       ));
    std::unique_ptr<char[],std::default_delete<char[]>>::
    unique_ptr<char*,std::default_delete<char[]>,void,bool>
              ((unique_ptr<char[],std::default_delete<char[]>> *)&local_48,__p);
    vl[0].overflow_arg_area = local_118;
    vl[0]._0_8_ = &stack0x00000008;
    size = 0x30;
    local_38 = 0x10;
    pcVar1 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get(&local_48);
    buffer._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
    super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
    super__Head_base<0UL,_char_*,_false>._M_head_impl._4_4_ =
         vsnprintf(pcVar1,(long)(buffer._M_t.
                                 super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                                 super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                                 super__Head_base<0UL,_char_*,_false>._M_head_impl._4_4_ + 1),in_RSI
                   ,&local_38);
    bVar3 = buffer._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
            super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
            super__Head_base<0UL,_char_*,_false>._M_head_impl._4_4_ != -1;
    if (bVar3) {
      pcVar1 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get(&local_48);
      uVar2 = (ulong)buffer._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                     super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                     super__Head_base<0UL,_char_*,_false>._M_head_impl._4_4_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)fmt,pcVar1,uVar2,&local_49);
      std::allocator<char>::~allocator((allocator<char> *)&local_49);
    }
    local_60 = (uint)bVar3;
    std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr(&local_48);
    if (local_60 != 0) {
      return fmt;
    }
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"Unexpected vsnprintf failure");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline std::string Fmt(const char* fmt, ...) {
    va_list vl;
    va_start(vl, fmt);
    int size = std::vsnprintf(nullptr, 0, fmt, vl);
    va_end(vl);

    if (size != -1) {
        std::unique_ptr<char[]> buffer(new char[size + 1]);

        va_start(vl, fmt);
        size = std::vsnprintf(buffer.get(), size + 1, fmt, vl);
        va_end(vl);
        if (size != -1) {
            return std::string(buffer.get(), size);
        }
    }

    throw std::runtime_error("Unexpected vsnprintf failure");
}